

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQSharedState::SQSharedState(SQSharedState *this)

{
  SQSharedState *this_local;
  
  ::SQObjectPtr::SQObjectPtr(&this->_metamethodsmap);
  RefTable::RefTable(&this->_refs_table);
  ::SQObjectPtr::SQObjectPtr(&this->_registry);
  ::SQObjectPtr::SQObjectPtr(&this->_consts);
  ::SQObjectPtr::SQObjectPtr(&this->_constructoridx);
  ::SQObjectPtr::SQObjectPtr(&this->_root_vm);
  ::SQObjectPtr::SQObjectPtr(&this->_table_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_array_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_string_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_number_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_generator_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_closure_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_thread_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_class_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_instance_default_delegate);
  ::SQObjectPtr::SQObjectPtr(&this->_weakref_default_delegate);
  this->_compilererrorhandler = (SQCOMPILERERROR)0x0;
  this->_printfunc = (SQPRINTFUNCTION)0x0;
  this->_errorfunc = (SQPRINTFUNCTION)0x0;
  this->_debuginfo = false;
  this->_notifyallexceptions = false;
  this->_foreignptr = (SQUserPointer)0x0;
  this->_releasehook = (SQRELEASEHOOK)0x0;
  return;
}

Assistant:

SQSharedState::SQSharedState()
{
    _compilererrorhandler = NULL;
    _printfunc = NULL;
    _errorfunc = NULL;
    _debuginfo = false;
    _notifyallexceptions = false;
    _foreignptr = NULL;
    _releasehook = NULL;
}